

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputOptions.cpp
# Opt level: O1

Image * __thiscall nvtt::InputOptions::Private::image(Private *this,uint face,uint mipmap)

{
  return this->images[face * this->mipmapCount + mipmap].data.m_ptr;
}

Assistant:

const Image * InputOptions::Private::image(uint face, uint mipmap) const
{
	nvDebugCheck(face < faceCount);
	nvDebugCheck(mipmap < mipmapCount);

	const InputImage & image = this->images[face * mipmapCount + mipmap];
	nvDebugCheck(image.face == face);
	nvDebugCheck(image.mipLevel == mipmap);

	return image.data.ptr();
}